

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void slang::ast::getNetRanges
               (Expression *expr,SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *ranges)

{
  NetType *pNVar1;
  bool bVar2;
  bitwidth_t bVar3;
  Symbol *ranges_00;
  NetSymbol *pNVar4;
  reference pNVar5;
  ConcatenationExpression *this;
  ConversionExpression *this_00;
  AssignmentExpression *this_01;
  Expression *in_RSI;
  Expression *in_RDI;
  AssignmentExpression *assign;
  ConversionExpression *conv;
  Expression *op;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range4;
  bitwidth_t width;
  NetType *nt;
  Symbol *sym;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Type *in_stack_ffffffffffffff88;
  AssignmentExpression *in_stack_ffffffffffffff90;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_58;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_50;
  undefined8 in_stack_ffffffffffffffc0;
  Expression *in_stack_ffffffffffffffc8;
  
  ranges_00 = Expression::getSymbolReference
                        (in_stack_ffffffffffffffc8,SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0)
                        );
  if ((ranges_00 == (Symbol *)0x0) || (ranges_00->kind != Net)) {
    if (in_RDI->kind == Concatenation) {
      this = Expression::as<slang::ast::ConcatenationExpression>(in_RDI);
      local_50 = ConcatenationExpression::operands(this);
      local_58._M_current =
           (Expression **)
           std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                     (in_stack_ffffffffffffff78);
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                 in_stack_ffffffffffffff88);
      while (bVar2 = __gnu_cxx::
                     operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                 *)in_stack_ffffffffffffff78), ((bVar2 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ::operator*(&local_58);
        getNetRanges(in_RSI,(SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)ranges_00);
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ::operator++(&local_58);
      }
    }
    else if (in_RDI->kind == Conversion) {
      this_00 = Expression::as<slang::ast::ConversionExpression>(in_RDI);
      bVar2 = ConversionExpression::isImplicit(this_00);
      if (bVar2) {
        ConversionExpression::operand(this_00);
        getNetRanges(in_RSI,(SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)ranges_00);
      }
    }
    else if (in_RDI->kind == Assignment) {
      this_01 = Expression::as<slang::ast::AssignmentExpression>(in_RDI);
      bVar2 = AssignmentExpression::isLValueArg(in_stack_ffffffffffffff90);
      if (bVar2) {
        AssignmentExpression::left(this_01);
        getNetRanges(in_RSI,(SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)ranges_00);
      }
    }
  }
  else {
    pNVar4 = Symbol::as<slang::ast::NetSymbol>((Symbol *)0x1078d2f);
    pNVar1 = pNVar4->netType;
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x1078d4c);
    bVar3 = Type::getBitWidth(in_stack_ffffffffffffff88);
    bVar2 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::empty
                      ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)in_RSI);
    if ((bVar2) ||
       (pNVar5 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::back
                           ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)in_RSI),
       pNVar5->netType != pNVar1)) {
      SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::push_back
                ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (NetTypeRange *)in_stack_ffffffffffffff78);
    }
    else {
      pNVar5 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::back
                         ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)in_RSI);
      pNVar5->width = bVar3 + pNVar5->width;
    }
  }
  return;
}

Assistant:

static void getNetRanges(const Expression& expr,
                         SmallVectorBase<PortSymbol::NetTypeRange>& ranges) {
    if (auto sym = expr.getSymbolReference(); sym && sym->kind == SymbolKind::Net) {
        auto& nt = sym->as<NetSymbol>().netType;
        bitwidth_t width = expr.type->getBitWidth();

        if (!ranges.empty() && ranges.back().netType == &nt)
            ranges.back().width += width;
        else
            ranges.push_back({&nt, width});
    }
    else if (expr.kind == ExpressionKind::Concatenation) {
        for (auto op : expr.as<ConcatenationExpression>().operands())
            getNetRanges(*op, ranges);
    }
    else if (expr.kind == ExpressionKind::Conversion) {
        auto& conv = expr.as<ConversionExpression>();
        if (conv.isImplicit())
            getNetRanges(conv.operand(), ranges);
    }
    else if (expr.kind == ExpressionKind::Assignment) {
        auto& assign = expr.as<AssignmentExpression>();
        if (assign.isLValueArg())
            getNetRanges(assign.left(), ranges);
    }
}